

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

char * quicly_hexdump(uint8_t *bytes,size_t len,size_t indent)

{
  byte bVar1;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  size_t sVar5;
  long lVar6;
  char *pcVar7;
  char cVar8;
  char *pcVar9;
  uint8_t uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  
  if (indent == 0xffffffffffffffff) {
    lVar14 = len * 2;
  }
  else {
    lVar14 = (len + 0xf >> 4) * (indent + 0x48);
  }
  pcVar2 = (char *)malloc((size_t)(lVar14 + 1));
  if (pcVar2 == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar7 = pcVar2;
    if (indent == 0xffffffffffffffff) {
      if (len != 0) {
        sVar5 = 0;
        do {
          bVar1 = bytes[sVar5];
          *pcVar7 = "0123456789abcdef"[bVar1 >> 4];
          pcVar7[1] = "0123456789abcdef"[bVar1 & 0xf];
          pcVar7 = pcVar7 + 2;
          sVar5 = sVar5 + 1;
        } while (len != sVar5);
      }
    }
    else if (len != 0) {
      uVar12 = 0;
      uVar13 = 0;
      do {
        pcVar3 = pcVar7;
        if (indent != 0) {
          memset(pcVar7,0x20,indent);
          pcVar3 = pcVar7 + indent;
        }
        *pcVar3 = "0123456789abcdef"[(uint)(uVar13 >> 8) & 0xf];
        pcVar3[1] = "0123456789abcdef"[(uint)(uVar13 >> 4) & 0xf];
        pcVar3[2] = "0123456789abcdef"[(uint)uVar13 & 0xf];
        pcVar3[3] = '0';
        pcVar3[4] = ' ';
        lVar4 = 0;
        pcVar3 = pcVar7 + indent + 0xb;
        uVar11 = uVar12;
        do {
          pcVar9 = pcVar3;
          lVar6 = lVar4;
          cVar8 = ' ';
          if (lVar6 == 0x18) {
            cVar8 = '-';
          }
          pcVar7[lVar6 + indent + 5] = cVar8;
          if (uVar11 < len) {
            bVar1 = bytes[uVar11];
            pcVar7[lVar6 + indent + 6] = "0123456789abcdef"[bVar1 >> 4];
            pcVar7[lVar6 + indent + 7] = "0123456789abcdef"[bVar1 & 0xf];
          }
          else {
            (pcVar7 + lVar6 + indent + 6)[0] = ' ';
            (pcVar7 + lVar6 + indent + 6)[1] = ' ';
          }
          uVar11 = uVar11 + 1;
          lVar4 = lVar6 + 3;
          pcVar3 = pcVar9 + 3;
        } while (lVar6 + 3 != 0x30);
        (pcVar7 + lVar6 + 1 + indent + 7)[0] = ' ';
        (pcVar7 + lVar6 + 1 + indent + 7)[1] = ' ';
        lVar4 = 0x10;
        uVar11 = uVar12;
        do {
          pcVar3 = pcVar9;
          uVar10 = ' ';
          if ((uVar11 < len) && (uVar10 = bytes[uVar11], 0x5e < (byte)(uVar10 - 0x20))) {
            uVar10 = '.';
          }
          pcVar3[-1] = uVar10;
          pcVar7 = pcVar3 + 1;
          uVar11 = uVar11 + 1;
          lVar4 = lVar4 + -1;
          pcVar9 = pcVar7;
        } while (lVar4 != 0);
        *pcVar3 = '\n';
        uVar13 = uVar13 + 1;
        uVar12 = uVar12 + 0x10;
      } while (uVar13 * 0x10 < len);
    }
    *pcVar7 = '\0';
    if ((char *)(lVar14 + 1) < pcVar7 + (1 - (long)pcVar2)) {
      __assert_fail("p - buf <= bufsize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0x17a6,"char *quicly_hexdump(const uint8_t *, size_t, size_t)");
    }
  }
  return pcVar2;
}

Assistant:

char *quicly_hexdump(const uint8_t *bytes, size_t len, size_t indent)
{
    size_t i, line, row, bufsize = indent == SIZE_MAX ? len * 2 + 1 : (indent + 5 + 3 * 16 + 2 + 16 + 1) * ((len + 15) / 16) + 1;
    char *buf, *p;

    if ((buf = malloc(bufsize)) == NULL)
        return NULL;
    p = buf;
    if (indent == SIZE_MAX) {
        for (i = 0; i != len; ++i) {
            quicly_byte_to_hex(p, bytes[i]);
            p += 2;
        }
    } else {
        for (line = 0; line * 16 < len; ++line) {
            for (i = 0; i < indent; ++i)
                *p++ = ' ';
            quicly_byte_to_hex(p, (line >> 4) & 0xff);
            p += 2;
            quicly_byte_to_hex(p, (line << 4) & 0xff);
            p += 2;
            *p++ = ' ';
            for (row = 0; row < 16; ++row) {
                *p++ = row == 8 ? '-' : ' ';
                if (line * 16 + row < len) {
                    quicly_byte_to_hex(p, bytes[line * 16 + row]);
                    p += 2;
                } else {
                    *p++ = ' ';
                    *p++ = ' ';
                }
            }
            *p++ = ' ';
            *p++ = ' ';
            for (row = 0; row < 16; ++row) {
                if (line * 16 + row < len) {
                    int ch = bytes[line * 16 + row];
                    *p++ = 0x20 <= ch && ch < 0x7f ? ch : '.';
                } else {
                    *p++ = ' ';
                }
            }
            *p++ = '\n';
        }
    }
    *p++ = '\0';

    assert(p - buf <= bufsize);

    return buf;
}